

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_banded.c
# Opt level: O0

parasail_result_t *
parasail_nw_banded(char *_s1,int s1Len,char *_s2,int s2Len,int open,int gap,int k,
                  parasail_matrix_t *matrix)

{
  int iVar1;
  int iVar2;
  int *ptr;
  int *ptr_00;
  int *b;
  int *b_00;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  int matval;
  int F_ext;
  int F_opn;
  int E_ext;
  int E_opn;
  int H_dag;
  int pos;
  int F;
  int colOff;
  int colLen;
  int low;
  int j;
  int i;
  int *E;
  int *EB;
  int *H;
  int *HB;
  int *s2;
  int *s1;
  parasail_result_t *result;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *_s2_local;
  int s1Len_local;
  char *_s1_local;
  
  if (_s1 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_banded","_s1");
    _s1_local = (char *)0x0;
  }
  else if (s1Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_banded","s1Len");
    _s1_local = (char *)0x0;
  }
  else if (_s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_banded","_s2");
    _s1_local = (char *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_banded","s2Len");
    _s1_local = (char *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_banded","open");
    _s1_local = (char *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_banded","gap");
    _s1_local = (char *)0x0;
  }
  else if (k < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_banded","k");
    _s1_local = (char *)0x0;
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_banded","matrix");
    _s1_local = (char *)0x0;
  }
  else {
    _s1_local = (char *)parasail_result_new();
    if ((parasail_result_t *)_s1_local == (parasail_result_t *)0x0) {
      _s1_local = (char *)0x0;
    }
    else {
      ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x1400181;
      ptr = parasail_memalign_int(0x10,(long)s1Len);
      ptr_00 = parasail_memalign_int(0x10,(long)s2Len);
      if (ptr == (int *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_00 == (int *)0x0) {
        _s1_local = (char *)0x0;
      }
      else {
        colOff = (s1Len - s2Len) - k;
        if (s2Len < s1Len) {
          colOff = (s2Len - s1Len) - k;
        }
        iVar1 = k - colOff;
        iVar2 = iVar1 + 1;
        if (s2Len < s1Len) {
          local_a8 = -k;
        }
        else {
          local_a8 = colOff;
        }
        pos = local_a8;
        b = parasail_memalign_int(0x10,(long)(iVar1 + 3));
        if (b == (int *)0x0) {
          _s1_local = (char *)0x0;
        }
        else {
          b_00 = parasail_memalign_int(0x10,(long)(iVar1 + 3));
          if (b_00 == (int *)0x0) {
            _s1_local = (char *)0x0;
          }
          else {
            parasail_memset_int(b,0,(long)(iVar1 + 3));
            parasail_memset_int(b_00,0,(long)(iVar1 + 3));
            for (low = 0; low < s1Len; low = low + 1) {
              ptr[low] = matrix->mapper[(byte)_s1[low]];
            }
            for (colLen = 0; colLen < s2Len; colLen = colLen + 1) {
              ptr_00[colLen] = matrix->mapper[(byte)_s2[colLen]];
            }
            low = -local_a8;
            colLen = 0;
            while (low = low + 1, low < iVar2) {
              b[(long)low + 1] = -(colLen * gap) - open;
              b_00[(long)low + 1] = -0x40000000;
              colLen = colLen + 1;
            }
            b[(long)(-1 - local_a8) + 1] = -open;
            b_00[(long)(-1 - local_a8) + 1] = -0x40000000;
            b[(long)-local_a8 + 1] = 0;
            b_00[(long)-local_a8 + 1] = -0x40000000;
            *b = -0x40000000;
            *b_00 = -0x40000000;
            b[(long)iVar2 + 1] = -0x40000000;
            b_00[(long)iVar2 + 1] = -0x40000000;
            for (colLen = 0; colLen < s2Len; colLen = colLen + 1) {
              H_dag = -0x40000000;
              if (pos < 0) {
                b[(long)(-1 - pos) + 1] = -(colLen * gap) - open;
              }
              for (low = 0; low < iVar2; low = low + 1) {
                iVar1 = pos + low;
                if ((-1 < iVar1) && (iVar1 < s1Len)) {
                  if (matrix->type == 0) {
                    local_ac = matrix->matrix[matrix->size * ptr[iVar1] + ptr_00[colLen]];
                  }
                  else {
                    local_ac = matrix->matrix[matrix->size * iVar1 + ptr_00[colLen]];
                  }
                  local_bc = b[(long)low + 1] + local_ac;
                  local_b0 = b_00[(long)(low + 1) + 1] - gap;
                  iVar1 = b[(long)(low + -1) + 1];
                  local_b4 = H_dag - gap;
                  if (local_b0 < b[(long)(low + 1) + 1] - open) {
                    local_b0 = b[(long)(low + 1) + 1] - open;
                  }
                  b_00[(long)low + 1] = local_b0;
                  if (local_b4 < iVar1 - open) {
                    local_b4 = iVar1 - open;
                  }
                  H_dag = local_b4;
                  if (local_b4 < b_00[(long)low + 1]) {
                    local_b8 = b_00[(long)low + 1];
                  }
                  else {
                    local_b8 = local_b4;
                  }
                  b[(long)low + 1] = local_b8;
                  if (local_bc < b[(long)low + 1]) {
                    local_bc = b[(long)low + 1];
                  }
                  b[(long)low + 1] = local_bc;
                }
              }
              pos = pos + 1;
            }
            if (s2Len < s1Len) {
              local_c0 = b[(long)-colOff + 1];
            }
            else {
              local_c0 = b[(long)k + 1];
            }
            ((parasail_result_t *)_s1_local)->score = local_c0;
            ((parasail_result_t *)_s1_local)->end_query = s1Len + -1;
            ((parasail_result_t *)_s1_local)->end_ref = s2Len + -1;
            parasail_free(b_00);
            parasail_free(b);
            parasail_free(ptr_00);
            parasail_free(ptr);
          }
        }
      }
    }
  }
  return (parasail_result_t *)_s1_local;
}

Assistant:

parasail_result_t* ENAME(
        const char * const restrict _s1, const int s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const int k,
        const parasail_matrix_t *matrix)
{
    /* declare local variables */
    parasail_result_t *result = NULL;
    int * restrict s1 = NULL;
    int * restrict s2 = NULL;
    int * HB = NULL;
    int * H = NULL;
    int * EB = NULL;
    int * E = NULL;
    int i = 0;
    int j = 0;
    int low = 0;
    int colLen = 0;
    int colOff = 0;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s1);
    PARASAIL_CHECK_GT0(s1Len);
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_GT0(k);
    PARASAIL_CHECK_NULL(matrix);

    /* initialize stack variables */

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_NOVEC
        | PARASAIL_FLAG_BANDED
        | PARASAIL_FLAG_BITS_INT | PARASAIL_FLAG_LANES_1;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initalize heap variables */
    s1 = parasail_memalign_int(16, s1Len);
    s2 = parasail_memalign_int(16, s2Len);

    /* validate heap variables */
    if (!s1) return NULL;
    if (!s2) return NULL;

    low = s1Len - s2Len - k;
    if (s1Len > s2Len) {
        low = s2Len - s1Len - k;
    }
    colLen = k-low+1;
    colOff = s1Len > s2Len ? -k : low;

    HB = parasail_memalign_int(16, colLen+2);
    if (!HB) return NULL;
    H = HB+1;
    EB = parasail_memalign_int(16, colLen+2);
    if (!EB) return NULL;
    E = EB+1;
    parasail_memset_int(HB, 0, colLen+2);
    parasail_memset_int(EB, 0, colLen+2);

    for (i=0; i<s1Len; ++i) {
        s1[i] = matrix->mapper[(unsigned char)_s1[i]];
    }
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }

#ifdef PARASAIL_TABLE
    /* fill the table with zeros */
    {
        int limit = s1Len*s2Len;
        for (i=0; i<limit; ++i) {
            result->tables->score_table[i] = 0;
        }
    }
#endif

    /* initialize H */
    /* initialize E */
    for (i=-colOff+1,j=0; i<colLen; ++i, ++j) {
        H[i] = -open - j*gap;
        E[i] = NEG_INF_32;
    }
    H[-colOff-1] = -open;
    E[-colOff-1] = NEG_INF_32;
    H[-colOff] = 0;
    E[-colOff] = NEG_INF_32;
    H[-1] = NEG_INF_32;
    E[-1] = NEG_INF_32;
    H[colLen] = NEG_INF_32;
    E[colLen] = NEG_INF_32;

    /* iter over db */
    for (j=0; j<s2Len; ++j) {
        /* substitution matrix row (really we wanted a column) */
        int F = NEG_INF_32;
        if (colOff < 0) {
            H[-colOff-1] = -open - j*gap;
        }
        /* iter over query */
        for (i=0; i<colLen; ++i) {
            int pos = 0;
            int H_dag = 0;
            int E_opn = 0;
            int E_ext = 0;
            int F_opn = 0;
            int F_ext = 0;
            int matval = 0;
            pos = colOff+i;
            if (pos < 0 || pos >= s1Len) {
                continue;
            }
            matval = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ?
                     matrix->matrix[matrix->size*s1[pos]+s2[j]] :
                     matrix->matrix[matrix->size*pos+s2[j]];
            H_dag = H[i] + matval;
            E_opn = H[i+1] - open;
            E_ext = E[i+1] - gap;
            F_opn = H[i-1] - open;
            F_ext = F - gap;
            E[i] = MAX(E_opn, E_ext);
            F = MAX(F_opn, F_ext);
            H[i] = MAX(E[i], F);
            H[i] = MAX(H[i], H_dag);
#ifdef PARASAIL_TABLE
            result->tables->score_table[pos*s2Len + j] = H[i];
#endif
        }
        colOff += 1;
    }

    result->score = s1Len > s2Len ? H[-low] : H[k];
    result->end_query = s1Len-1;
    result->end_ref = s2Len-1;

    parasail_free(EB);
    parasail_free(HB);
    parasail_free(s2);
    parasail_free(s1);

    return result;
}